

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

void __thiscall spvtools::opt::IRContext::BuildInvalidAnalyses(IRContext *this,Analysis set)

{
  Analysis AVar1;
  Analysis set_local;
  IRContext *this_local;
  
  AVar1 = set & (this->valid_analyses_ ^ ~kAnalysisNone);
  if ((AVar1 & kAnalysisBegin) != kAnalysisNone) {
    BuildDefUseManager(this);
  }
  if ((AVar1 & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    BuildInstrToBlockMapping(this);
  }
  if ((AVar1 & kAnalysisDecorations) != kAnalysisNone) {
    BuildDecorationManager(this);
  }
  if ((AVar1 & kAnalysisCFG) != kAnalysisNone) {
    BuildCFG(this);
  }
  if ((AVar1 & kAnalysisDominatorAnalysis) != kAnalysisNone) {
    ResetDominatorAnalysis(this);
  }
  if ((AVar1 & kAnalysisLoopAnalysis) != kAnalysisNone) {
    ResetLoopAnalysis(this);
  }
  if ((AVar1 & kAnalysisBuiltinVarId) != kAnalysisNone) {
    ResetBuiltinAnalysis(this);
  }
  if ((AVar1 & kAnalysisNameMap) != kAnalysisNone) {
    BuildIdToNameMap(this);
  }
  if ((AVar1 & kAnalysisScalarEvolution) != kAnalysisNone) {
    BuildScalarEvolutionAnalysis(this);
  }
  if ((AVar1 & kAnalysisRegisterPressure) != kAnalysisNone) {
    BuildRegPressureAnalysis(this);
  }
  if ((AVar1 & kAnalysisValueNumberTable) != kAnalysisNone) {
    BuildValueNumberTable(this);
  }
  if ((AVar1 & kAnalysisStructuredCFG) != kAnalysisNone) {
    BuildStructuredCFGAnalysis(this);
  }
  if ((AVar1 & kAnalysisIdToFuncMapping) != kAnalysisNone) {
    BuildIdToFuncMapping(this);
  }
  if ((AVar1 & kAnalysisConstants) != kAnalysisNone) {
    BuildConstantManager(this);
  }
  if ((AVar1 & kAnalysisTypes) != kAnalysisNone) {
    BuildTypeManager(this);
  }
  if ((AVar1 & kAnalysisDebugInfo) != kAnalysisNone) {
    BuildDebugInfoManager(this);
  }
  if ((AVar1 & kAnalysisLiveness) != kAnalysisNone) {
    BuildLivenessManager(this);
  }
  return;
}

Assistant:

void IRContext::BuildInvalidAnalyses(IRContext::Analysis set) {
  set = Analysis(set & ~valid_analyses_);

  if (set & kAnalysisDefUse) {
    BuildDefUseManager();
  }
  if (set & kAnalysisInstrToBlockMapping) {
    BuildInstrToBlockMapping();
  }
  if (set & kAnalysisDecorations) {
    BuildDecorationManager();
  }
  if (set & kAnalysisCFG) {
    BuildCFG();
  }
  if (set & kAnalysisDominatorAnalysis) {
    ResetDominatorAnalysis();
  }
  if (set & kAnalysisLoopAnalysis) {
    ResetLoopAnalysis();
  }
  if (set & kAnalysisBuiltinVarId) {
    ResetBuiltinAnalysis();
  }
  if (set & kAnalysisNameMap) {
    BuildIdToNameMap();
  }
  if (set & kAnalysisScalarEvolution) {
    BuildScalarEvolutionAnalysis();
  }
  if (set & kAnalysisRegisterPressure) {
    BuildRegPressureAnalysis();
  }
  if (set & kAnalysisValueNumberTable) {
    BuildValueNumberTable();
  }
  if (set & kAnalysisStructuredCFG) {
    BuildStructuredCFGAnalysis();
  }
  if (set & kAnalysisIdToFuncMapping) {
    BuildIdToFuncMapping();
  }
  if (set & kAnalysisConstants) {
    BuildConstantManager();
  }
  if (set & kAnalysisTypes) {
    BuildTypeManager();
  }
  if (set & kAnalysisDebugInfo) {
    BuildDebugInfoManager();
  }
  if (set & kAnalysisLiveness) {
    BuildLivenessManager();
  }
}